

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O1

void __thiscall Dice::rollDice(Dice *this,bool testing)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  int iVar4;
  undefined7 in_register_00000031;
  int i;
  long lVar5;
  int numbOfDice;
  int local_3c;
  double local_38;
  
  if ((int)CONCAT71(in_register_00000031,testing) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"How many dice do you want to roll? \n",0x24);
    std::istream::operator>>((istream *)&std::cin,&local_3c);
    if (0 < local_3c) {
      iVar4 = 0;
      do {
        iVar1 = rand();
        this->totalDiceValues[(uint)(iVar1 % 6)] = this->totalDiceValues[(uint)(iVar1 % 6)] + 1;
        iVar4 = iVar4 + 1;
      } while (iVar4 < local_3c);
    }
    lVar5 = 0;
    do {
      local_38 = ((double)this->totalDiceValues[lVar5] / (double)local_3c) * 100.0;
      __s = this->DiceNames[lVar5];
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1281d0);
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," : ",3);
      poVar3 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,this->totalDiceValues[lVar5]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": Probability = ",0x10);
      poVar3 = std::ostream::_M_insert<double>(local_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
  }
  return;
}

Assistant:

void Dice::rollDice(bool testing) {

    if(!testing)
    {return;}

    int numbOfDice;
    cout << "How many dice do you want to roll? \n";
    cin >> numbOfDice;
    DiceOptions value;

    for(int i=0; i<numbOfDice; i++)
    {
        value = randomDiceOption();
        this->totalDiceValues[value]++ ;
    }
    double probability=0.00;
    for(int i=0; i<6; i++) {
        probability = double(this->totalDiceValues[i]) / double(numbOfDice) *100.00 ;
        cout << DiceNames[i] << " : " << this->totalDiceValues[i] << ": Probability = " << probability << "%" <<  endl;
    }
}